

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketGroup<MediumAllocationBlockAttributes>::Initialize
          (HeapBucketGroup<MediumAllocationBlockAttributes> *this,HeapInfo *heapInfo,uint sizeCat)

{
  TBlockAllocatorType *this_00;
  TBlockAllocatorType *this_01;
  TBlockAllocatorType *this_02;
  TBlockAllocatorType *this_03;
  TBlockAllocatorType *this_04;
  bool bVar1;
  ulong objectSize;
  
  (this->heapBucket).
  super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucket.heapInfo = heapInfo;
  objectSize = (ulong)sizeCat;
  bVar1 = HeapInfo::IsPageHeapEnabledForBlock<MediumAllocationBlockAttributes>(heapInfo,objectSize);
  (this->heapBucket).
  super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucket.isPageHeapEnabled = bVar1;
  (this->heapBucket).
  super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucket.sizeCat = sizeCat;
  this_00 = &(this->heapBucket).
             super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
             .super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
             allocatorHead;
  SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
  Initialize(this_00);
  (this->heapBucket).
  super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.allocatorHead.
  bucket = (HeapBucket *)this;
  (this->heapBucket).
  super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
  lastExplicitFreeListAllocator = this_00;
  (this->leafHeapBucket).
  super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>.super_HeapBucket.
  heapInfo = heapInfo;
  bVar1 = HeapInfo::IsPageHeapEnabledForBlock<MediumAllocationBlockAttributes>(heapInfo,objectSize);
  (this->leafHeapBucket).
  super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>.super_HeapBucket.
  isPageHeapEnabled = bVar1;
  (this->leafHeapBucket).
  super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>.super_HeapBucket.
  sizeCat = sizeCat;
  this_01 = &(this->leafHeapBucket).
             super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>.
             allocatorHead;
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::Initialize
            (this_01);
  (this->leafHeapBucket).
  super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>.allocatorHead.
  bucket = (HeapBucket *)&this->leafHeapBucket;
  (this->leafHeapBucket).
  super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>.
  lastExplicitFreeListAllocator = this_01;
  (this->smallNormalWithBarrierHeapBucket).
  super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucket.heapInfo = heapInfo;
  bVar1 = HeapInfo::IsPageHeapEnabledForBlock<MediumAllocationBlockAttributes>(heapInfo,objectSize);
  (this->smallNormalWithBarrierHeapBucket).
  super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucket.isPageHeapEnabled = bVar1;
  (this->smallNormalWithBarrierHeapBucket).
  super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucket.sizeCat = sizeCat;
  this_02 = &(this->smallNormalWithBarrierHeapBucket).
             super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             .
             super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             .allocatorHead;
  SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::Initialize(this_02);
  (this->smallNormalWithBarrierHeapBucket).
  super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>.
  allocatorHead.bucket = (HeapBucket *)&this->smallNormalWithBarrierHeapBucket;
  (this->smallNormalWithBarrierHeapBucket).
  super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>.
  lastExplicitFreeListAllocator = this_02;
  (this->smallFinalizableWithBarrierHeapBucket).
  super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucket.heapInfo = heapInfo;
  bVar1 = HeapInfo::IsPageHeapEnabledForBlock<MediumAllocationBlockAttributes>(heapInfo,objectSize);
  (this->smallFinalizableWithBarrierHeapBucket).
  super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucket.isPageHeapEnabled = bVar1;
  (this->smallFinalizableWithBarrierHeapBucket).
  super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucket.sizeCat = sizeCat;
  this_03 = &(this->smallFinalizableWithBarrierHeapBucket).
             super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             .
             super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             .
             super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             .allocatorHead;
  SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::Initialize(this_03);
  (this->smallFinalizableWithBarrierHeapBucket).
  super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .allocatorHead.bucket = (HeapBucket *)&this->smallFinalizableWithBarrierHeapBucket;
  (this->smallFinalizableWithBarrierHeapBucket).
  super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  .lastExplicitFreeListAllocator = this_03;
  (this->finalizableHeapBucket).
  super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucket.heapInfo = heapInfo;
  bVar1 = HeapInfo::IsPageHeapEnabledForBlock<MediumAllocationBlockAttributes>(heapInfo,objectSize);
  (this->finalizableHeapBucket).
  super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucket.isPageHeapEnabled = bVar1;
  (this->finalizableHeapBucket).
  super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>.
  super_HeapBucket.sizeCat = sizeCat;
  this_04 = &(this->finalizableHeapBucket).
             super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
             .
             super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
             .
             super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
             .allocatorHead;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
  Initialize(this_04);
  (this->finalizableHeapBucket).
  super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>.
  allocatorHead.bucket = (HeapBucket *)&this->finalizableHeapBucket;
  (this->finalizableHeapBucket).
  super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  .
  super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  .super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>.
  lastExplicitFreeListAllocator = this_04;
  return;
}

Assistant:

void
HeapBucketGroup<TBlockAttributes>::Initialize(HeapInfo * heapInfo, uint sizeCat)
{
    heapBucket.Initialize(heapInfo, sizeCat);
    leafHeapBucket.Initialize(heapInfo, sizeCat);
#ifdef RECYCLER_WRITE_BARRIER
    smallNormalWithBarrierHeapBucket.Initialize(heapInfo, sizeCat);
    smallFinalizableWithBarrierHeapBucket.Initialize(heapInfo, sizeCat);
#endif
    finalizableHeapBucket.Initialize(heapInfo, sizeCat);
#ifdef RECYCLER_VISITED_HOST
    recyclerVisitedHostHeapBucket.Initialize(heapInfo, sizeCat);
#endif
}